

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall LowererMD::LoadArgumentsFromFrame(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint32 offset_00;
  StackSym *pSVar3;
  undefined4 *puVar4;
  RegOpnd *baseOpnd_00;
  IndirOpnd *newSrc;
  Opnd *newSrc_00;
  int32 offset;
  RegOpnd *baseOpnd;
  Instr *instr_local;
  LowererMD *this_local;
  
  bVar2 = Func::IsLoopBody(this->m_func);
  if (bVar2) {
    pSVar3 = Func::GetLoopParamSym(this->m_func);
    if (pSVar3 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,600,"(this->m_func->GetLoopParamSym())","this->m_func->GetLoopParamSym()")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pSVar3 = Func::GetLoopParamSym(this->m_func);
    baseOpnd_00 = IR::RegOpnd::New(pSVar3,TyInt64,this->m_func);
    offset_00 = Js::InterpreterStackFrame::GetOffsetOfArguments();
    newSrc = IR::IndirOpnd::New(baseOpnd_00,offset_00,TyInt64,this->m_func,false);
    IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  }
  else {
    newSrc_00 = CreateStackArgumentsSlotOpnd(this->m_func);
    IR::Instr::SetSrc1(instr,newSrc_00);
  }
  instr->m_opcode = MOV;
  return instr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LoadArgumentsFromFrame(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Get the arguments ptr from the interpreter frame instance that was passed in.
        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        int32 offset = (int32)Js::InterpreterStackFrame::GetOffsetOfArguments();
        instr->SetSrc1(IR::IndirOpnd::New(baseOpnd, offset, TyMachReg, this->m_func));
    }
    else
    {
        instr->SetSrc1(LowererMD::CreateStackArgumentsSlotOpnd(this->m_func));
    }

    instr->m_opcode = Js::OpCode::MOV;

    return instr->m_prev;
}